

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

StringEntry * __thiscall
cmELFInternalImpl<cmELFTypes64>::GetDynamicSectionString
          (cmELFInternalImpl<cmELFTypes64> *this,uint tag)

{
  _Rb_tree_header *p_Var1;
  pointer paVar2;
  ulong uVar3;
  istream *piVar4;
  cmELF *pcVar5;
  mapped_type *pmVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  byte bVar9;
  long lVar10;
  ELF_Dyn *dyn;
  pointer paVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  char c;
  char local_5d;
  uint local_5c;
  mapped_type *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  p_Var1 = &(this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = (this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_parent;
  p_Var8 = &p_Var1->_M_header;
  for (; p_Var12 != (_Base_ptr)0x0; p_Var12 = (&p_Var12->_M_left)[bVar15]) {
    bVar15 = p_Var12[1]._M_color < tag;
    if (!bVar15) {
      p_Var8 = p_Var12;
    }
  }
  p_Var12 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var8 != p_Var1) && (p_Var12 = p_Var8, tag < p_Var8[1]._M_color)) {
    p_Var12 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var12 != p_Var1) {
    if (p_Var12[2]._M_parent != (_Base_ptr)0x0) {
      return (StringEntry *)&p_Var12[1]._M_parent;
    }
    return (mapped_type *)0x0;
  }
  local_5c = tag;
  local_58 = std::
             map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
             ::operator[](&(this->super_cmELFInternal).DynamicSectionStrings,&local_5c);
  local_58->Position = 0;
  local_58->Size = 0;
  local_58->IndexInSection = -1;
  bVar15 = LoadDynamicSection(this);
  if (bVar15) {
    paVar2 = (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->SectionHeaders).
                      super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)paVar2 >> 6) <=
        (ulong)paVar2[(this->super_cmELFInternal).DynamicSectionIndex].sh_link) {
      pcVar5 = (this->super_cmELFInternal).External;
      std::__cxx11::string::_M_replace
                ((ulong)&pcVar5->ErrorMessage,0,(char *)(pcVar5->ErrorMessage)._M_string_length,
                 0x565492);
      (this->super_cmELFInternal).ELFType = FileTypeInvalid;
      return (mapped_type *)0x0;
    }
    paVar11 = (this->DynamicSectionEntries).
              super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (paVar11 !=
        (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pmVar6 = (mapped_type *)
               ((ulong)paVar2[(this->super_cmELFInternal).DynamicSectionIndex].sh_link * 0x40);
      lVar10 = (long)&(pmVar6->Value)._M_dataplus._M_p + (long)paVar2;
      local_40 = lVar10;
      do {
        uVar14 = paVar11->d_tag;
        local_48 = (ulong)local_5c;
        if (uVar14 == local_48) {
          uVar13 = (paVar11->d_un).d_val;
          uVar3 = *(ulong *)(lVar10 + 0x20);
          if (uVar13 < uVar3) {
            bVar9 = 0;
            local_50 = uVar14;
            std::istream::seekg((this->super_cmELFInternal).Stream,*(long *)(lVar10 + 0x18) + uVar13
                                ,0);
            local_38 = uVar13;
            do {
              plVar7 = (long *)std::istream::get((char *)(this->super_cmELFInternal).Stream);
              uVar14 = uVar13;
              if (((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) != 0) ||
                 ((bool)(bVar9 & local_5d != '\0'))) break;
              if (local_5d == '\0') {
                bVar9 = 1;
              }
              else {
                std::__cxx11::string::push_back((char)local_58);
              }
              uVar13 = uVar13 + 1;
              uVar14 = uVar3;
            } while (uVar3 != uVar13);
            lVar10 = local_40;
            piVar4 = (this->super_cmELFInternal).Stream;
            if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
              local_58->Position = local_38 + *(long *)(local_40 + 0x18);
              local_58->Size = uVar14 - local_38;
              local_58->IndexInSection =
                   (int)((ulong)((long)paVar11 -
                                (long)(this->DynamicSectionEntries).
                                      super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 4);
              pmVar6 = local_58;
              uVar14 = local_50;
            }
            else {
              pcVar5 = (this->super_cmELFInternal).External;
              std::__cxx11::string::_M_replace
                        ((ulong)&pcVar5->ErrorMessage,0,
                         (char *)(pcVar5->ErrorMessage)._M_string_length,0x56550a);
              (this->super_cmELFInternal).ELFType = FileTypeInvalid;
              std::__cxx11::string::_M_replace
                        ((ulong)local_58,0,(char *)(local_58->Value)._M_string_length,0x5822d2);
              pmVar6 = (mapped_type *)0x0;
              uVar14 = local_50;
            }
          }
          else {
            pcVar5 = (this->super_cmELFInternal).External;
            std::__cxx11::string::_M_replace
                      ((ulong)&pcVar5->ErrorMessage,0,
                       (char *)(pcVar5->ErrorMessage)._M_string_length,0x5654c2);
            (this->super_cmELFInternal).ELFType = FileTypeInvalid;
            pmVar6 = (mapped_type *)0x0;
          }
        }
        if (uVar14 == local_48) {
          return pmVar6;
        }
        paVar11 = paVar11 + 1;
        if (paVar11 ==
            (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          return (mapped_type *)0x0;
        }
      } while( true );
    }
  }
  return (mapped_type *)0x0;
}

Assistant:

cmELF::StringEntry const* cmELFInternalImpl<Types>::GetDynamicSectionString(
  unsigned int tag)
{
  // Short-circuit if already checked.
  std::map<unsigned int, StringEntry>::iterator dssi =
    this->DynamicSectionStrings.find(tag);
  if (dssi != this->DynamicSectionStrings.end()) {
    if (dssi->second.Position > 0) {
      return &dssi->second;
    }
    return nullptr;
  }

  // Create an entry for this tag.  Assume it is missing until found.
  StringEntry& se = this->DynamicSectionStrings[tag];
  se.Position = 0;
  se.Size = 0;
  se.IndexInSection = -1;

  // Try reading the dynamic section.
  if (!this->LoadDynamicSection()) {
    return nullptr;
  }

  // Get the string table referenced by the DYNAMIC section.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if (sec.sh_link >= this->SectionHeaders.size()) {
    this->SetErrorMessage("Section DYNAMIC has invalid string table index.");
    return nullptr;
  }
  ELF_Shdr const& strtab = this->SectionHeaders[sec.sh_link];

  // Look for the requested entry.
  for (typename std::vector<ELF_Dyn>::iterator di =
         this->DynamicSectionEntries.begin();
       di != this->DynamicSectionEntries.end(); ++di) {
    ELF_Dyn& dyn = *di;
    if (static_cast<tagtype>(dyn.d_tag) == static_cast<tagtype>(tag)) {
      // We found the tag requested.
      // Make sure the position given is within the string section.
      if (dyn.d_un.d_val >= strtab.sh_size) {
        this->SetErrorMessage("Section DYNAMIC references string beyond "
                              "the end of its string section.");
        return nullptr;
      }

      // Seek to the position reported by the entry.
      unsigned long first = static_cast<unsigned long>(dyn.d_un.d_val);
      unsigned long last = first;
      unsigned long end = static_cast<unsigned long>(strtab.sh_size);
      this->Stream.seekg(strtab.sh_offset + first);

      // Read the string.  It may be followed by more than one NULL
      // terminator.  Count the total size of the region allocated to
      // the string.  This assumes that the next string in the table
      // is non-empty, but the "chrpath" tool makes the same
      // assumption.
      bool terminated = false;
      char c;
      while (last != end && this->Stream.get(c) && !(terminated && c)) {
        ++last;
        if (c) {
          se.Value += c;
        } else {
          terminated = true;
        }
      }

      // Make sure the whole value was read.
      if (!this->Stream) {
        this->SetErrorMessage("Dynamic section specifies unreadable RPATH.");
        se.Value = "";
        return nullptr;
      }

      // The value has been read successfully.  Report it.
      se.Position = static_cast<unsigned long>(strtab.sh_offset + first);
      se.Size = last - first;
      se.IndexInSection =
        static_cast<int>(di - this->DynamicSectionEntries.begin());
      return &se;
    }
  }
  return nullptr;
}